

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.cpp
# Opt level: O0

void __thiscall xmrig::Controller::stop(Controller *this)

{
  long in_RDI;
  Miner *unaff_retaddr;
  Base *in_stack_ffffffffffffffe0;
  
  Base::stop(in_stack_ffffffffffffffe0);
  if (*(long **)(in_RDI + 0x20) != (long *)0x0) {
    (**(code **)(**(long **)(in_RDI + 0x20) + 8))();
  }
  *(undefined8 *)(in_RDI + 0x20) = 0;
  Miner::stop(unaff_retaddr);
  if (*(long **)(in_RDI + 0x18) != (long *)0x0) {
    (**(code **)(**(long **)(in_RDI + 0x18) + 8))();
  }
  *(undefined8 *)(in_RDI + 0x18) = 0;
  return;
}

Assistant:

void xmrig::Controller::stop()
{
    Base::stop();

    delete m_network;
    m_network = nullptr;

    m_miner->stop();

    delete m_miner;
    m_miner = nullptr;
}